

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadStr(BinaryReader *this,string_view *out_str,char *desc)

{
  bool bVar1;
  const_pointer s;
  size_type s_length;
  string_view local_40;
  Enum local_30;
  uint32_t local_2c;
  char *pcStack_28;
  uint32_t str_len;
  char *desc_local;
  string_view *out_str_local;
  BinaryReader *this_local;
  
  local_2c = 0;
  pcStack_28 = desc;
  desc_local = (char *)out_str;
  out_str_local = (string_view *)this;
  local_30 = (Enum)ReadU32Leb128(this,&local_2c,"string length");
  bVar1 = Failed((Result)local_30);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (this->read_end_ < (this->state_).offset + (ulong)local_2c) {
    PrintError(this,"unable to read string: %s",pcStack_28);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    string_view::string_view
              (&local_40,(char *)((this->state_).data + (this->state_).offset),(ulong)local_2c);
    *(char **)desc_local = local_40.data_;
    *(size_type *)(desc_local + 8) = local_40.size_;
    (this->state_).offset = (ulong)local_2c + (this->state_).offset;
    s = string_view::data((string_view *)desc_local);
    s_length = string_view::length((string_view *)desc_local);
    bVar1 = IsValidUtf8(s,s_length);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      PrintError(this,"invalid utf-8 encoding: %s",pcStack_28);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadStr(string_view* out_str, const char* desc) {
  uint32_t str_len = 0;
  CHECK_RESULT(ReadU32Leb128(&str_len, "string length"));

  ERROR_UNLESS(state_.offset + str_len <= read_end_,
               "unable to read string: %s", desc);

  *out_str = string_view(
      reinterpret_cast<const char*>(state_.data) + state_.offset, str_len);
  state_.offset += str_len;

  ERROR_UNLESS(IsValidUtf8(out_str->data(), out_str->length()),
               "invalid utf-8 encoding: %s", desc);
  return Result::Ok;
}